

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

int countint(TValue *key,int *nums)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  luai_Cast u;
  uint local_10;
  
  if (key->tt_ == 3) {
    dVar1 = (key->value_).n;
    local_10 = SUB84(dVar1 + 6755399441055744.0,0);
    if ((dVar1 == (double)(int)local_10) && (!NAN(dVar1) && !NAN((double)(int)local_10)))
    goto LAB_00110af6;
  }
  local_10 = 0xffffffff;
LAB_00110af6:
  bVar2 = local_10 - 1 < 0x40000000;
  if (bVar2) {
    iVar3 = luaO_ceillog2(local_10);
    nums[iVar3] = nums[iVar3] + 1;
  }
  return (uint)bVar2;
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[luaO_ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}